

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

string * __thiscall
gimage::(anonymous_namespace)::readPNMToken_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,istream *in)

{
  int iVar1;
  string *psVar2;
  char c;
  ostringstream s;
  char local_19a;
  char local_199;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::istream::get((char *)this);
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0) {
    while ((((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0 &&
           (iVar1 = isspace((int)local_19a), iVar1 != 0))) {
      std::istream::get((char *)this);
    }
    if (local_19a == '#') {
      while (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) == 0) {
        std::istream::get((char *)this);
      }
    }
  }
  do {
    if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 2) != 0) {
LAB_001324ff:
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_198);
      psVar2 = (string *)std::ios_base::~ios_base(local_128);
      return psVar2;
    }
    iVar1 = isspace((int)local_19a);
    if ((local_19a == 0x23) || (iVar1 != 0)) {
      if (local_19a == '#') {
        std::istream::unget();
      }
      goto LAB_001324ff;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_199,1);
    std::istream::get((char *)this);
  } while( true );
}

Assistant:

std::string readPNMToken(std::istream &in)
{
  char c;
  std::ostringstream s;

  // read the first character of the token (ignoring white spaces and
  // comments in front the token)

  in.get(c);

  while (!in.eof())
  {
    while (!in.eof() && isspace(c))
    {
      in.get(c);
    }

    if (c == '#')
    {
      while (!in.eof() && c != '\n' && c != '\r')
      {
        in.get(c);
      }
    }
    else
    {
      break;
    }
  }

  // reading a token until white space or start of comment

  while (!in.eof() && !isspace(c) && c != '#')
  {
    s << c;
    in.get(c);
  }

  // put last character back if it was the start of a comment

  if (!in.eof() && c == '#')
  {
    in.unget();
  }

  return s.str();
}